

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeAtomTypesSectionParser.cpp
# Opt level: O3

void __thiscall
OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingChargeAtomTypesSectionParser
          (FluctuatingChargeAtomTypesSectionParser *this,ForceFieldOptions *options)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  mapped_type *pmVar3;
  key_type local_48;
  
  (this->super_SectionParser).sectionName_._M_dataplus._M_p =
       (pointer)&(this->super_SectionParser).sectionName_.field_2;
  (this->super_SectionParser).sectionName_._M_string_length = 0;
  (this->super_SectionParser).sectionName_.field_2._M_local_buf[0] = '\0';
  (this->super_SectionParser)._vptr_SectionParser =
       (_func_int **)&PTR__FluctuatingChargeAtomTypesSectionParser_00300a88;
  this_00 = &this->stringToEnumMap_;
  p_Var1 = &(this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->options_ = options;
  paVar2 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"FluctuatingChargeAtomTypes","");
  std::__cxx11::string::_M_assign((string *)&(this->super_SectionParser).sectionName_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Hardness","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum>_>_>
           ::operator[](this_00,&local_48);
  *pmVar3 = fqtHardness;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"EAM","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum>_>_>
           ::operator[](this_00,&local_48);
  *pmVar3 = fqtEAM;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"EAMPoly","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum>_>_>
           ::operator[](this_00,&local_48);
  *pmVar3 = fqtEAMPolynomial;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"DREAM2","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum>_>_>
           ::operator[](this_00,&local_48);
  *pmVar3 = fqtDREAM2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

FluctuatingChargeAtomTypesSectionParser::
      FluctuatingChargeAtomTypesSectionParser(ForceFieldOptions& options) :
      options_(options) {
    setSectionName("FluctuatingChargeAtomTypes");

    stringToEnumMap_["Hardness"] = fqtHardness;
    stringToEnumMap_["EAM"]      = fqtEAM;
    stringToEnumMap_["EAMPoly"]  = fqtEAMPolynomial;
    stringToEnumMap_["DREAM2"]   = fqtDREAM2;
  }